

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_move16_32(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int ay;
  int ax;
  uint16 w2;
  
  uVar1 = m68ki_read_imm_16();
  uVar2 = m68ki_cpu.ir & 7;
  uVar3 = (int)(uVar1 & 0xffff) >> 0xc & 7;
  uVar1 = m68ki_cpu.dar[(long)(int)uVar3 + 8];
  uVar4 = m68ki_cpu.s_flag | 1;
  uVar5 = m68ki_read_32_fc(m68ki_cpu.dar[(long)(int)uVar2 + 8],
                           m68ki_cpu.s_flag | m68ki_address_space);
  m68ki_write_32_fc(uVar1,uVar4,uVar5);
  uVar1 = m68ki_cpu.dar[(long)(int)uVar3 + 8];
  uVar4 = m68ki_cpu.s_flag | 1;
  uVar5 = m68ki_read_32_fc(m68ki_cpu.dar[(long)(int)uVar2 + 8] + 4,
                           m68ki_cpu.s_flag | m68ki_address_space);
  m68ki_write_32_fc(uVar1 + 4,uVar4,uVar5);
  uVar1 = m68ki_cpu.dar[(long)(int)uVar3 + 8];
  uVar4 = m68ki_cpu.s_flag | 1;
  uVar5 = m68ki_read_32_fc(m68ki_cpu.dar[(long)(int)uVar2 + 8] + 8,
                           m68ki_cpu.s_flag | m68ki_address_space);
  m68ki_write_32_fc(uVar1 + 8,uVar4,uVar5);
  uVar1 = m68ki_cpu.dar[(long)(int)uVar3 + 8];
  uVar4 = m68ki_cpu.s_flag | 1;
  uVar5 = m68ki_read_32_fc(m68ki_cpu.dar[(long)(int)uVar2 + 8] + 0xc,
                           m68ki_cpu.s_flag | m68ki_address_space);
  m68ki_write_32_fc(uVar1 + 0xc,uVar4,uVar5);
  m68ki_cpu.dar[(long)(int)uVar2 + 8] = m68ki_cpu.dar[(long)(int)uVar2 + 8] + 0x10;
  m68ki_cpu.dar[(long)(int)uVar3 + 8] = m68ki_cpu.dar[(long)(int)uVar3 + 8] + 0x10;
  return;
}

Assistant:

static void m68k_op_move16_32(void)
{
	uint16 w2 = OPER_I_16();
	int ax = REG_IR & 7;
	int ay = (w2 >> 12) & 7;

	m68ki_write_32(REG_A[ay],    m68ki_read_32(REG_A[ax]));
	m68ki_write_32(REG_A[ay]+4,  m68ki_read_32(REG_A[ax]+4));
	m68ki_write_32(REG_A[ay]+8,  m68ki_read_32(REG_A[ax]+8));
	m68ki_write_32(REG_A[ay]+12, m68ki_read_32(REG_A[ax]+12));

	REG_A[ax] += 16;
	REG_A[ay] += 16;
}